

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CheckVisibilityRules(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__1,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  AlphaNum local_118;
  AlphaNum local_e8;
  AlphaNum local_b8;
  AlphaNum local_88;
  AlphaNum local_58;
  
  local_58.piece_ = NullSafeStringView("\"");
  local_88.piece_._M_len = (size_t)**(ushort **)(**(long **)this + 8);
  local_88.piece_._M_str =
       (char *)(~local_88.piece_._M_len + (long)*(ushort **)(**(long **)this + 8));
  local_b8.piece_ =
       NullSafeStringView(
                         "\" is a nested enum and cannot be marked `export` with STRICT default_symbol_visibility. It must be moved to top-level, ideally in its own file in order to be `export`. For C++ namespacing of enums in a messages use: `local message <OuterNamespace> { export enum "
                         );
  local_e8.piece_._M_len = (size_t)**(ushort **)(**(long **)this + 8);
  local_e8.piece_._M_str =
       (char *)(~local_e8.piece_._M_len + (long)*(ushort **)(**(long **)this + 8));
  local_118.piece_ = NullSafeStringView(" {...} reserved 1 to max; }`");
  StrCat<>(__return_storage_ptr__,&local_58,&local_88,&local_b8,&local_e8,&local_118);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}